

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

bool __thiscall
miniros::MasterLink::getParamImpl<float>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
          *map,bool cached)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  mapped_type_conflict1 *pmVar4;
  float fVar5;
  RpcValue xml_value;
  RpcValue local_48;
  XmlRpcValue local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_48,cached);
  if (bVar1 && local_48._type == TypeStruct) {
    iVar2 = XmlRpc::XmlRpcValue::begin_abi_cxx11_(&local_48);
    while( true ) {
      iVar3 = XmlRpc::XmlRpcValue::end_abi_cxx11_(&local_48);
      bVar1 = iVar2._M_node == iVar3._M_node;
      if ((bVar1) || (2 < iVar2._M_node[2]._M_color - _S_black)) break;
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_38,(XmlRpcValue *)(iVar2._M_node + 2));
      fVar5 = xml_cast<float>(&local_38);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
               ::operator[](map,(key_type *)(iVar2._M_node + 1));
      *pmVar4 = fVar5;
      XmlRpc::XmlRpcValue::~XmlRpcValue(&local_38);
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_48);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::map<std::string, T>& map, bool cached)
{
  RpcValue xml_value;
  if (!getParamImpl(key, xml_value, cached)) {
    return false;
  }

  // Make sure it's a struct type
  if (xml_value.getType() != RpcValue::TypeStruct) {
    return false;
  }

  // Fill the map with stuff
  for (auto it = xml_value.begin(); it != xml_value.end(); ++it) {
    // Make sure this element is the right type
    if (!xml_castable<T>(it->second.getType())) {
      return false;
    }
    // Store the element
    map[it->first] = xml_cast<T>(it->second);
  }

  return true;
}